

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_controller.h
# Opt level: O2

void __thiscall
r_exec::HLPController::_store_evidence<r_exec::HLPController::PEEntry>
          (HLPController *this,Cache<r_exec::HLPController::PEEntry> *cache,_Fact *evidence)

{
  list<r_exec::HLPController::PEEntry> *this_00;
  pointer pcVar1;
  byte bVar2;
  ulong uVar3;
  _iterator _Var4;
  const_iterator cVar5;
  PEEntry e;
  const_iterator local_60;
  PEEntry local_50;
  
  PEEntry::PEEntry(&local_50,evidence);
  std::mutex::lock(&cache->mutex);
  uVar3 = (*Now)();
  this_00 = &cache->evidences;
  cVar5._list = this_00;
  cVar5.super__iterator._cell = (cache->evidences).used_cells_head;
  local_60._list = this_00;
  while( true ) {
    _Var4 = cVar5.super__iterator._cell;
    local_60.super__iterator._cell = _Var4._cell;
    if (_Var4._cell == -1) break;
    pcVar1 = ((cVar5._list)->cells).
             super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar2 = (**(code **)(**(long **)&pcVar1[_Var4._cell].data.super_EEntry + 0x70))();
    if ((bVar2 | *(uint64_t *)((long)&pcVar1[_Var4._cell].data.super_EEntry + 0x10) < uVar3) == 1) {
      cVar5 = r_code::list<r_exec::HLPController::PEEntry>::erase(this_00,&local_60);
      local_60._list = cVar5._list;
    }
    else {
      cVar5._list = local_60._list;
      cVar5.super__iterator._cell =
           ((local_60._list)->cells).
           super__Vector_base<r_code::list<r_exec::HLPController::PEEntry>::cell,_std::allocator<r_code::list<r_exec::HLPController::PEEntry>::cell>_>
           ._M_impl.super__Vector_impl_data._M_start[local_60.super__iterator._cell].next;
    }
  }
  r_code::list<r_exec::HLPController::PEEntry>::push_front(this_00,&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)cache);
  core::P<r_exec::_Fact>::~P((P<r_exec::_Fact> *)&local_50);
  return;
}

Assistant:

void _store_evidence(Cache<E> *cache, _Fact *evidence)
    {
        E e(evidence);
        std::lock_guard<std::mutex> guard(cache->mutex);
        uint64_t now = r_exec::Now();
        typename r_code::list<E>::const_iterator _e;

        for (_e = cache->evidences.begin(); _e != cache->evidences.end();) {
            if ((*_e).is_too_old(now)) { // garbage collection.
                _e = cache->evidences.erase(_e);
            } else {
                ++_e;
            }
        }

        cache->evidences.push_front(e);
    }